

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AddWarning
          (DescriptorBuilder *this,string_view element_name,Message *descriptor,
          ErrorLocation location,
          FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          make_error)

{
  ErrorCollector *pEVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined4 uVar4;
  pointer pcVar5;
  LogMessage *pLVar6;
  string error;
  LogMessage local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  size_type local_38;
  pointer pcStack_30;
  
  (*make_error.invoker_)(&local_58,make_error.ptr_);
  pEVar1 = this->error_collector_;
  if (pEVar1 == (ErrorCollector *)0x0) {
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x1317);
    pLVar6 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (local_68,(string *)&this->filename_);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(pLVar6,1," ");
    pLVar6 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar6,element_name._M_len,element_name._M_str);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(pLVar6,2,": ");
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar6,(string *)&local_58);
    absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_68);
  }
  else {
    local_38 = local_58._M_string_length;
    sVar3 = local_38;
    pcStack_30 = local_58._M_dataplus._M_p;
    pcVar5 = pcStack_30;
    local_38._0_4_ = (undefined4)local_58._M_string_length;
    uVar2 = (undefined4)local_38;
    pcStack_30._0_4_ = SUB84(local_58._M_dataplus._M_p,0);
    uVar4 = pcStack_30._0_4_;
    local_38 = sVar3;
    pcStack_30 = pcVar5;
    (*pEVar1->_vptr_ErrorCollector[3])
              (pEVar1,(this->filename_)._M_string_length,(this->filename_)._M_dataplus._M_p,
               element_name._M_len,element_name._M_str,descriptor,location,uVar2,uVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorBuilder::AddWarning(
    const absl::string_view element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    absl::FunctionRef<std::string()> make_error) {
  std::string error = make_error();
  if (error_collector_ == nullptr) {
    ABSL_LOG(WARNING) << filename_ << " " << element_name << ": " << error;
  } else {
    error_collector_->RecordWarning(filename_, element_name, &descriptor,
                                    location, error);
  }
}